

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestScriptHandler.cxx
# Opt level: O0

cmDuration __thiscall cmCTestScriptHandler::GetRemainingTimeAllowed(cmCTestScriptHandler *this)

{
  bool bVar1;
  pointer this_00;
  char *__nptr;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_80;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  duration<double,_std::ratio<1L,_1L>_> local_70;
  __enable_if_is_duration<std::chrono::duration<double>_> duration;
  duration<double,_std::ratio<1L,_1L>_> local_60;
  cmDuration timelimit;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue timelimitS;
  cmCTestScriptHandler *this_local;
  
  timelimitS.Value = (string *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Makefile);
  if (bVar1) {
    this_00 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                        (&this->Makefile);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"CTEST_TIME_LIMIT",&local_41);
    local_20 = cmMakefile::GetDefinition(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    bVar1 = cmValue::operator_cast_to_bool(&local_20);
    if (bVar1) {
      cmValue::operator->[abi_cxx11_(&local_20);
      __nptr = (char *)std::__cxx11::string::c_str();
      duration.__r = atof(__nptr);
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_60,&duration.__r);
      local_80.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      local_78.__r = (rep)std::chrono::operator-(&local_80,&this->ScriptStartTime);
      local_70.__r = (rep_conflict)
                     std::chrono::
                     duration_cast<std::chrono::duration<double,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                               (&local_78);
      this_local = (cmCTestScriptHandler *)std::chrono::operator-(&local_60,&local_70);
    }
    else {
      this_local = (cmCTestScriptHandler *)cmCTest::MaxDuration();
    }
  }
  else {
    this_local = (cmCTestScriptHandler *)cmCTest::MaxDuration();
  }
  return (cmDuration)(rep_conflict)this_local;
}

Assistant:

cmDuration cmCTestScriptHandler::GetRemainingTimeAllowed()
{
  if (!this->Makefile) {
    return cmCTest::MaxDuration();
  }

  cmValue timelimitS = this->Makefile->GetDefinition("CTEST_TIME_LIMIT");

  if (!timelimitS) {
    return cmCTest::MaxDuration();
  }

  auto timelimit = cmDuration(atof(timelimitS->c_str()));

  auto duration = std::chrono::duration_cast<cmDuration>(
    std::chrono::steady_clock::now() - this->ScriptStartTime);
  return (timelimit - duration);
}